

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ConditionalExpression::fromSyntax
          (Compilation *comp,ConditionalExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  char *pcVar1;
  ConditionalPredicateSyntax *pCVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  SyntaxNode *pSVar4;
  TempVarSymbol *pTVar5;
  size_t __n;
  size_t sVar6;
  Expression *this;
  uint uVar7;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  ASTContext *ctx;
  Compilation *pCVar12;
  ConditionalExpressionSyntax *pCVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  ulong uVar20;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar21;
  pointer ppPVar22;
  InvalidPattern *pIVar23;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar24;
  Expression *this_00;
  Type *pTVar25;
  undefined4 extraout_var_00;
  ConditionalExpression *expr;
  SourceLocation SVar26;
  Diagnostic *pDVar27;
  Diagnostic *pDVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  bitmask<slang::ast::ASTFlags> bVar32;
  EVP_PKEY_CTX *src;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
  *ppVar33;
  pointer ppPVar34;
  Type *this_01;
  ulong pos0;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  byte bVar38;
  ulong uVar39;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
  *ppVar40;
  undefined8 uVar41;
  Type *pTVar42;
  undefined1 auVar43 [16];
  SourceRange range;
  string_view arg;
  bool isConst;
  bool isTrue;
  try_emplace_args_t local_289;
  Expression *local_288;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
  *local_280;
  TempVarSymbol *local_278;
  ASTContext *local_270;
  Compilation *local_268;
  ulong local_260;
  undefined8 local_258;
  ConditionalExpressionSyntax *local_250;
  uint64_t local_248;
  basic_string_view<char,_std::char_traits<char>_> *local_240;
  pointer local_238;
  locator res;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_96UL,_16UL>_>
  varMap;
  ASTContext trueContext;
  value_type *elements;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> vars;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> conditions;
  
  isConst = true;
  isTrue = true;
  conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.data_ =
       (pointer)conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.
                firstElement;
  conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.len = 0;
  conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.cap = 2;
  trueContext.assertionInstance = context->assertionInstance;
  trueContext.scope.ptr = (context->scope).ptr;
  trueContext.lookupIndex = context->lookupIndex;
  trueContext._12_4_ = *(undefined4 *)&context->field_0xc;
  trueContext.flags.m_bits._0_1_ = (undefined1)(context->flags).m_bits;
  trueContext.flags.m_bits._1_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 1);
  trueContext.flags.m_bits._2_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 2);
  trueContext.flags.m_bits._3_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 3);
  trueContext.flags.m_bits._4_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 4);
  trueContext.flags.m_bits._5_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 5);
  trueContext.flags.m_bits._6_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 6);
  trueContext.flags.m_bits._7_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 7);
  trueContext.instanceOrProc._0_1_ = *(undefined1 *)&context->instanceOrProc;
  trueContext.instanceOrProc._1_1_ = *(undefined1 *)((long)&context->instanceOrProc + 1);
  trueContext.instanceOrProc._2_1_ = *(undefined1 *)((long)&context->instanceOrProc + 2);
  trueContext.instanceOrProc._3_1_ = *(undefined1 *)((long)&context->instanceOrProc + 3);
  trueContext.instanceOrProc._4_1_ = *(undefined1 *)((long)&context->instanceOrProc + 4);
  trueContext.instanceOrProc._5_1_ = *(undefined1 *)((long)&context->instanceOrProc + 5);
  trueContext.instanceOrProc._6_1_ = *(undefined1 *)((long)&context->instanceOrProc + 6);
  trueContext.instanceOrProc._7_1_ = *(undefined1 *)((long)&context->instanceOrProc + 7);
  trueContext.firstTempVar = context->firstTempVar;
  trueContext.randomizeDetails = context->randomizeDetails;
  pCVar2 = (syntax->predicate).ptr;
  uVar20 = (pCVar2->conditions).elements._M_extent._M_extent_value + 1;
  uVar41 = 0;
  uVar39 = 0;
  local_270 = context;
  local_268 = comp;
  local_250 = syntax;
  if (1 < uVar20) {
    uVar39 = 0;
    uVar41 = 0;
    uVar31 = 0;
    do {
      ppSVar21 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((pCVar2->conditions).elements._M_ptr + uVar31 * 2));
      pSVar3 = *ppSVar21;
      local_288 = Expression::selfDetermined
                            (comp,*(ExpressionSyntax **)(pSVar3 + 1),&trueContext,
                             (bitmask<slang::ast::ASTFlags>)0x0);
      bVar17 = Expression::bad(local_288);
      bVar38 = (byte)uVar39 | bVar17;
      uVar39 = CONCAT71((int7)(uVar39 >> 8),bVar38);
      pSVar4 = pSVar3[1].parent;
      if (pSVar4 == (SyntaxNode *)0x0) {
        bVar17 = Type::isFourState((local_288->type).ptr);
        uVar41 = CONCAT71((int7)((ulong)uVar41 >> 8),(byte)uVar41 | bVar17);
        if (bVar38 == 0) {
          bVar17 = ASTContext::requireBooleanConvertible(&trueContext,local_288);
          uVar39 = 0;
          if (!bVar17) {
            uVar39 = 1;
          }
        }
        pIVar23 = (InvalidPattern *)0x0;
      }
      else {
        pSVar4 = pSVar4[1].previewNode;
        pTVar42 = (local_288->type).ptr;
        vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.len = 0;
        vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_ =
             (pointer)vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.firstElement;
        vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.cap = 5;
        bVar17 = Pattern::createPatternVars(&trueContext,(PatternSyntax *)pSVar4,pTVar42,&vars);
        if (bVar17) {
          varMap.super_Storage.ptr = (char *)&varMap;
          varMap._112_8_ = 0x3f;
          varMap._120_8_ = 1;
          varMap._128_16_ = ZEXT816(0x516460);
          varMap._144_8_ = 0;
          varMap._152_8_ = 0;
          varMap.super_Storage._104_8_ = varMap.super_Storage.ptr;
          if (vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.len != 0) {
            ppPVar22 = vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_ +
                       vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.len;
            ppPVar34 = vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_;
            local_260 = uVar39;
            local_258 = uVar41;
            local_238 = ppPVar22;
            do {
              pTVar5 = &(*ppPVar34)->super_TempVarSymbol;
              local_278 = pTVar5;
              if ((pTVar5->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len != 0) {
                local_240 = &(pTVar5->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
                local_248 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                            operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                        *)&varMap.super_Storage.field_0x68,local_240);
                uVar14 = varMap._120_8_;
                pos0 = local_248 >> (varMap._112_1_ & 0x3f);
                uVar15 = varMap._128_8_;
                lVar35 = (local_248 & 0xff) * 4;
                cVar8 = (&UNK_0051605c)[lVar35];
                cVar9 = (&UNK_0051605d)[lVar35];
                cVar10 = (&UNK_0051605e)[lVar35];
                cVar11 = (&UNK_0051605f)[lVar35];
                uVar16 = varMap._136_8_;
                uVar29 = (uint)local_248;
                uVar37 = 0;
                uVar36 = pos0;
                do {
                  pcVar1 = (char *)(uVar15 + uVar36 * 0x10);
                  auVar43[0] = -(*pcVar1 == cVar8);
                  auVar43[1] = -(pcVar1[1] == cVar9);
                  auVar43[2] = -(pcVar1[2] == cVar10);
                  auVar43[3] = -(pcVar1[3] == cVar11);
                  auVar43[4] = -(pcVar1[4] == cVar8);
                  auVar43[5] = -(pcVar1[5] == cVar9);
                  auVar43[6] = -(pcVar1[6] == cVar10);
                  auVar43[7] = -(pcVar1[7] == cVar11);
                  auVar43[8] = -(pcVar1[8] == cVar8);
                  auVar43[9] = -(pcVar1[9] == cVar9);
                  auVar43[10] = -(pcVar1[10] == cVar10);
                  auVar43[0xb] = -(pcVar1[0xb] == cVar11);
                  auVar43[0xc] = -(pcVar1[0xc] == cVar8);
                  auVar43[0xd] = -(pcVar1[0xd] == cVar9);
                  auVar43[0xe] = -(pcVar1[0xe] == cVar10);
                  auVar43[0xf] = -(pcVar1[0xf] == cVar11);
                  uVar30 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe);
                  if (uVar30 != 0) {
                    __n = (pTVar5->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len;
                    pcVar1 = (pTVar5->super_VariableSymbol).super_ValueSymbol.super_Symbol.name.
                             _M_str;
                    do {
                      uVar7 = 0;
                      if (uVar30 != 0) {
                        for (; (uVar30 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                        }
                      }
                      ppVar40 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                                 *)((ulong)uVar7 * 0x18 + uVar16 + uVar36 * 0x168);
                      sVar6 = (ppVar40->first)._M_len;
                      bVar17 = __n == sVar6;
                      if ((__n != 0) && (__n == sVar6)) {
                        iVar19 = bcmp(pcVar1,(ppVar40->first)._M_str,__n);
                        bVar17 = iVar19 == 0;
                      }
                      uVar39 = local_260;
                      uVar41 = local_258;
                      comp = local_268;
                      if (bVar17) goto LAB_004b79ef;
                      uVar30 = uVar30 - 1 & uVar30;
                    } while (uVar30 != 0);
                  }
                  if ((*(byte *)(uVar36 * 0x10 + uVar15 + 0xf) &
                      (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        is_not_overflowed(unsigned_long)::shift)[uVar29 & 7]) == 0) break;
                  lVar35 = uVar36 + uVar37;
                  uVar37 = uVar37 + 1;
                  uVar36 = lVar35 + 1U & uVar14;
                } while (uVar37 <= (ulong)uVar14);
                local_280 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                             *)0x0;
                ppVar40 = local_280;
LAB_004b79ef:
                local_280 = ppVar40;
                ppVar40 = local_280;
                ppVar33 = local_280;
                if (local_280 ==
                    (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                     *)0x0) {
                  if ((ulong)varMap._152_8_ < (ulong)varMap._144_8_) {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
                    ::
                    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PatternVarSymbol_const*&>
                              (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
                                     *)&varMap.super_Storage.field_0x68,
                               (arrays_type *)&varMap.field_0x70,pos0,local_248,&local_289,local_240
                               ,(PatternVarSymbol **)&local_278);
                    varMap._152_8_ = varMap._152_8_ + 1;
                    ppVar33 = res.p;
                  }
                  else {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
                    ::
                    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PatternVarSymbol_const*&>
                              (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
                                     *)&varMap.super_Storage.field_0x68,local_248,&local_289,
                               local_240,(PatternVarSymbol **)&local_278);
                    ppVar33 = res.p;
                  }
                }
                pTVar5 = trueContext.firstTempVar;
                if (ppVar40 ==
                    (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                     *)0x0) {
                  trueContext.firstTempVar = local_278;
                  local_278->nextTemp = pTVar5;
                  DeclaredType::forceResolveAt
                            (&(local_278->super_VariableSymbol).super_ValueSymbol.declaredType,
                             &trueContext);
                  ppPVar22 = local_238;
                }
                else {
                  pDVar27 = ASTContext::addDiag(&trueContext,(DiagCode)0x2a000a,
                                                (local_278->super_VariableSymbol).super_ValueSymbol.
                                                super_Symbol.location);
                  Diagnostic::operator<<
                            (pDVar27,(local_278->super_VariableSymbol).super_ValueSymbol.
                                     super_Symbol.name);
                  Diagnostic::addNote(pDVar27,(DiagCode)0x50001,ppVar33->second->location);
                  ppPVar22 = local_238;
                }
              }
              ppPVar34 = ppPVar34 + 1;
            } while (ppPVar34 != ppPVar22);
          }
          iVar19 = Pattern::bind((int)&trueContext,(sockaddr *)pSVar4,(socklen_t)pTVar42);
          pIVar23 = (InvalidPattern *)CONCAT44(extraout_var,iVar19);
          res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                   varMap.super_Storage._104_8_;
          if (varMap._136_8_ != 0) {
            slang::detail::hashing::
            StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_96UL,_16UL>
            ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_96UL,_16UL>
                          *)&res,(pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                                  *)varMap._136_8_,(varMap._120_8_ * 0x178 + 0x186U) / 0x18);
          }
        }
        else {
          varMap.super_Storage.buffer[0] = '\0';
          varMap.super_Storage.buffer[1] = '\0';
          varMap.super_Storage.buffer[2] = '\0';
          varMap.super_Storage.buffer[3] = '\0';
          varMap.super_Storage.buffer[4] = '\0';
          varMap.super_Storage.buffer[5] = '\0';
          varMap.super_Storage.buffer[6] = '\0';
          varMap.super_Storage.buffer[7] = '\0';
          pIVar23 = BumpAllocator::emplace<slang::ast::InvalidPattern,decltype(nullptr)>
                              (&comp->super_BumpAllocator,(void **)&varMap);
        }
        if (vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_ !=
            (pointer)vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.firstElement)
        {
          operator_delete(vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_);
        }
        uVar39 = CONCAT71((int7)(uVar39 >> 8),
                          (byte)uVar39 | (pIVar23->super_Pattern).kind == Invalid);
        isConst = false;
      }
      if (((uVar39 & 1) == 0) && (isConst == true)) {
        ASTContext::tryEval((ConstantValue *)&varMap,&trueContext,local_288);
        if ((varMap.super_Storage.buffer[0x20] == '\0') ||
           ((varMap.super_Storage.buffer[0x20] == '\x01' &&
            (pvVar24 = std::
                       get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                 ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&varMap), (pvVar24->super_SVIntStorage).unknownFlag == true))))
        {
          isConst = false;
        }
        else {
          bVar17 = ConstantValue::isTrue((ConstantValue *)&varMap);
          if (!bVar17) {
            isTrue = false;
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&varMap);
      }
      varMap.super_Storage.buffer._0_8_ = local_288;
      varMap.super_Storage.buffer._8_8_ = pIVar23;
      SmallVectorBase<slang::ast::ConditionalExpression::Condition>::
      emplace_back<slang::ast::ConditionalExpression::Condition>
                (&conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>,
                 (Condition *)&varMap);
      uVar31 = uVar31 + 1;
    } while (uVar31 != uVar20 >> 1);
    uVar39 = uVar39 & 0xffffffffffffff01;
  }
  pCVar13 = local_250;
  ctx = local_270;
  bVar17 = isConst;
  local_280 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
               *)CONCAT71(local_280._1_7_,isTrue);
  uVar20 = 0;
  if (isConst != false) {
    uVar20 = (ulong)(((byte)~isTrue & 1) * 2);
  }
  uVar31 = (local_270->flags).m_bits & 0x600;
  bVar32.m_bits = uVar20 + 0x200;
  if (uVar31 != 0x600) {
    bVar32.m_bits = uVar20;
  }
  local_260 = uVar39;
  local_258 = uVar41;
  local_288 = Expression::create(comp,(local_250->left).ptr,&trueContext,bVar32,assignmentTarget);
  uVar39 = (ulong)((uint)(bVar17 & (byte)local_280) * 2);
  bVar32.m_bits = uVar39 + 0x200;
  if ((int)uVar31 != 0x600) {
    bVar32.m_bits = uVar39;
  }
  this_00 = Expression::create(comp,(pCVar13->right).ptr,ctx,bVar32,assignmentTarget);
  uVar41 = local_258;
  bVar17 = Expression::bad(local_288);
  bVar18 = true;
  if (!bVar17) {
    bVar18 = Expression::bad(this_00);
  }
  pCVar12 = local_268;
  pTVar42 = (local_288->type).ptr;
  this_01 = (this_00->type).ptr;
  if (pTVar42->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar42);
  }
  if ((pTVar42->canonical->super_Symbol).kind == UnboundedType) {
    pTVar42 = pCVar12->intType;
  }
  if (this_01->canonical == (Type *)0x0) {
    Type::resolveCanonical(this_01);
  }
  if ((this_01->canonical->super_Symbol).kind == UnboundedType) {
    this_01 = pCVar12->intType;
  }
  pTVar25 = OpInfo::binaryType(pCVar12,pTVar42,this_01,(bool)((byte)uVar41 & 1),false);
  varMap.super_Storage.buffer._0_4_ =
       SmallVectorBase<slang::ast::ConditionalExpression::Condition>::copy
                 (&conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>,
                  (EVP_PKEY_CTX *)pCVar12,src);
  pCVar13 = local_250;
  varMap.super_Storage.buffer._4_4_ = extraout_var_00;
  local_280 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
               *)&local_250->question;
  res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
           parsing::Token::location((Token *)local_280);
  vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>._0_16_ =
       slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pCVar13);
  pCVar12 = local_268;
  expr = BumpAllocator::
         emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,std::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::SourceLocation,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange,bool&,bool&>
                   (&local_268->super_BumpAllocator,pTVar25,
                    (span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *)
                    &varMap,(SourceLocation *)&res,local_288,this_00,(SourceRange *)&vars,&isConst,
                    &isTrue);
  if ((char)local_260 != '\0' || bVar18 != false) {
    expr = (ConditionalExpression *)Expression::badExpr(pCVar12,&expr->super_Expression);
    goto LAB_004b8154;
  }
  bVar17 = Type::isNumeric(pTVar42);
  if ((!bVar17) || (bVar17 = Type::isNumeric(this_01), !bVar17)) {
    if (pTVar42->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar42);
    }
    if ((pTVar42->canonical->super_Symbol).kind == NullType) {
      if (this_01->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_01);
      }
      if ((this_01->canonical->super_Symbol).kind != NullType) goto LAB_004b7efd;
      pTVar25 = Compilation::getNullType(pCVar12);
      goto LAB_004b803a;
    }
LAB_004b7efd:
    if (pTVar42->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar42);
    }
    if ((pTVar42->canonical->super_Symbol).kind == ClassType) {
LAB_004b8001:
      if (pTVar42->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar42);
      }
      pTVar25 = this_01;
      if ((pTVar42->canonical->super_Symbol).kind != NullType) {
        if (this_01->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_01);
        }
        pTVar25 = pTVar42;
        if (((((this_01->canonical->super_Symbol).kind != NullType) &&
             (bVar17 = Type::isAssignmentCompatible(this_01,pTVar42), pTVar25 = this_01, !bVar17))
            && (bVar17 = Type::isAssignmentCompatible(pTVar42,this_01), pTVar25 = pTVar42, !bVar17))
           && ((pTVar25 = Type::getCommonBase(pTVar42,this_01), pTVar25 == (Type *)0x0 &&
               (bVar17 = Type::isEquivalent(pTVar42,this_01), pTVar25 = pTVar42, !bVar17)))) {
LAB_004b81d0:
          SVar26 = parsing::Token::location((Token *)local_280);
          pDVar27 = ASTContext::addDiag(local_270,(DiagCode)0x220007,SVar26);
          pDVar28 = ast::operator<<(pDVar27,pTVar42);
          ast::operator<<(pDVar28,this_01);
          Diagnostic::operator<<(pDVar27,local_288->sourceRange);
          Diagnostic::operator<<(pDVar27,this_00->sourceRange);
          expr = (ConditionalExpression *)Expression::badExpr(pCVar12,&expr->super_Expression);
          goto LAB_004b8154;
        }
      }
    }
    else {
      if (this_01->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_01);
      }
      if ((this_01->canonical->super_Symbol).kind == ClassType) goto LAB_004b8001;
      if (pTVar42->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar42);
      }
      if ((pTVar42->canonical->super_Symbol).kind == CHandleType) goto LAB_004b8001;
      if (this_01->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_01);
      }
      if ((this_01->canonical->super_Symbol).kind == CHandleType) goto LAB_004b8001;
      if (pTVar42->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar42);
      }
      if ((pTVar42->canonical->super_Symbol).kind == EventType) goto LAB_004b8001;
      if (this_01->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_01);
      }
      if ((this_01->canonical->super_Symbol).kind == EventType) goto LAB_004b8001;
      if (pTVar42->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar42);
      }
      if ((pTVar42->canonical->super_Symbol).kind == VirtualInterfaceType) goto LAB_004b8001;
      if (this_01->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_01);
      }
      if ((this_01->canonical->super_Symbol).kind == VirtualInterfaceType) goto LAB_004b8001;
      if (pTVar42->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar42);
      }
      if ((pTVar42->canonical->super_Symbol).kind == CovergroupType) goto LAB_004b8001;
      if (this_01->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_01);
      }
      if ((this_01->canonical->super_Symbol).kind == CovergroupType) goto LAB_004b8001;
      bVar17 = Type::isEquivalent(pTVar42,this_01);
      pTVar25 = pTVar42;
      if (!bVar17) {
        bVar17 = Expression::isImplicitString(local_288);
        if ((bVar17) && (bVar17 = Expression::isImplicitString(this_00), bVar17)) {
          pTVar25 = pCVar12->stringType;
          goto LAB_004b803a;
        }
        goto LAB_004b81d0;
      }
    }
LAB_004b803a:
    (expr->super_Expression).type.ptr = pTVar25;
  }
  if (((((conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.len == 1)
        && ((conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.data_)->
            pattern == (Pattern *)0x0)) &&
       (this = ((conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.
                data_)->expr).ptr, this->kind == BinaryOp)) &&
      (bVar17 = Expression::isParenthesized(this), !bVar17)) &&
     ((bVar17 = OpInfo::isArithmetic(*(BinaryOperator *)&this[1].constant), bVar17 ||
      (bVar17 = OpInfo::isShift(*(BinaryOperator *)&this[1].constant), bVar17)))) {
    arg = OpInfo::getText(*(BinaryOperator *)&this[1].constant);
    SVar26 = parsing::Token::location((Token *)local_280);
    pDVar27 = ASTContext::addDiag(local_270,(DiagCode)0xbc0007,SVar26);
    pDVar28 = Diagnostic::operator<<(pDVar27,arg);
    pDVar28 = Diagnostic::operator<<(pDVar28,arg);
    Diagnostic::operator<<(pDVar28,this->sourceRange);
    range.endLoc = (this_00->sourceRange).endLoc;
    range.startLoc = (SourceLocation)((this[1].type.ptr)->super_Symbol).parentScope;
    Diagnostic::addNote(pDVar27,(DiagCode)0xaf0007,range);
    pDVar27 = Diagnostic::addNote(pDVar27,(DiagCode)0xb30007,this->sourceRange);
    Diagnostic::operator<<(pDVar27,arg);
  }
  syntax_00._M_ptr =
       (local_250->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (local_250->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  ASTContext::setAttributes(local_270,&expr->super_Expression,syntax_00);
LAB_004b8154:
  if (conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.data_ !=
      (pointer)conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.
               firstElement) {
    operator_delete(conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.
                    data_);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& ConditionalExpression::fromSyntax(Compilation& comp,
                                              const ConditionalExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    bool bad = false;
    bool isConst = true;
    bool isTrue = true;
    bool isFourState = false;
    SmallVector<Condition> conditions;
    ASTContext trueContext = context;

    for (auto condSyntax : syntax.predicate->conditions) {
        auto& cond = selfDetermined(comp, *condSyntax->expr, trueContext);
        bad |= cond.bad();

        const Pattern* pattern = nullptr;
        if (condSyntax->matchesClause) {
            pattern = createPattern(comp, trueContext, *condSyntax->matchesClause->pattern,
                                    *cond.type);
            bad |= pattern->bad();

            // We don't consider the condition to be const if there's a pattern.
            isConst = false;
        }
        else {
            isFourState |= cond.type->isFourState();
            if (!bad && !trueContext.requireBooleanConvertible(cond))
                bad = true;
        }

        if (!bad && isConst) {
            ConstantValue condVal = trueContext.tryEval(cond);
            if (!condVal || (condVal.isInteger() && condVal.integer().hasUnknown()))
                isConst = false;
            else if (!condVal.isTrue())
                isTrue = false;
        }

        conditions.push_back({&cond, pattern});
    }

    // If the predicate is known at compile time, we can tell which branch will be unevaluated.
    bitmask<ASTFlags> leftFlags = ASTFlags::None;
    bitmask<ASTFlags> rightFlags = ASTFlags::None;
    if (isConst) {
        if (isTrue)
            rightFlags = ASTFlags::UnevaluatedBranch;
        else
            leftFlags = ASTFlags::UnevaluatedBranch;
    }

    // Pass through the flag allowing unbounded literals.
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral) &&
        context.flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) {
        leftFlags |= ASTFlags::AllowUnboundedLiteral;
        rightFlags |= ASTFlags::AllowUnboundedLiteral;
    }

    auto& left = create(comp, *syntax.left, trueContext, leftFlags, assignmentTarget);
    auto& right = create(comp, *syntax.right, context, rightFlags, assignmentTarget);
    bad |= left.bad() || right.bad();

    const Type* lt = left.type;
    const Type* rt = right.type;
    if (lt->isUnbounded())
        lt = &comp.getIntType();
    if (rt->isUnbounded())
        rt = &comp.getIntType();

    // Force four-state return type for ambiguous condition case.
    const Type* resultType = OpInfo::binaryType(comp, lt, rt, isFourState);
    auto result = comp.emplace<ConditionalExpression>(*resultType, conditions.copy(comp),
                                                      syntax.question.location(), left, right,
                                                      syntax.sourceRange(), isConst, isTrue);
    if (bad)
        return badExpr(comp, result);

    // If both sides of the expression are numeric, we've already determined the correct
    // result type. Otherwise, follow the rules in [11.14.11].
    bool good = true;
    if (!lt->isNumeric() || !rt->isNumeric()) {
        if (lt->isNull() && rt->isNull()) {
            result->type = &comp.getNullType();
        }
        else if (lt->isClass() || rt->isClass() || lt->isCHandle() || rt->isCHandle() ||
                 lt->isEvent() || rt->isEvent() || lt->isVirtualInterface() ||
                 rt->isVirtualInterface() || lt->isCovergroup() || rt->isCovergroup()) {
            if (lt->isNull())
                result->type = rt;
            else if (rt->isNull())
                result->type = lt;
            else if (rt->isAssignmentCompatible(*lt))
                result->type = rt;
            else if (lt->isAssignmentCompatible(*rt))
                result->type = lt;
            else if (auto common = Type::getCommonBase(*lt, *rt))
                result->type = common;
            else if (lt->isEquivalent(*rt))
                result->type = lt;
            else
                good = false;
        }
        else if (lt->isEquivalent(*rt)) {
            result->type = lt;
        }
        else if (left.isImplicitString() && right.isImplicitString()) {
            result->type = &comp.getStringType();
        }
        else {
            good = false;
        }
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadConditionalExpression, syntax.question.location());
        diag << *lt << *rt;
        diag << left.sourceRange;
        diag << right.sourceRange;
        return badExpr(comp, result);
    }

    // Warn about cases where a conditional expression and a binary operator
    // are mixed in a way that suggests the user mixed up the precedence order.
    // ex: `a + b ? 1 : 2`
    if (conditions.size() == 1 && !conditions[0].pattern) {
        if (auto binOp = conditions[0].expr->as_if<BinaryExpression>();
            binOp && !binOp->isParenthesized()) {
            if (OpInfo::isArithmetic(binOp->op) || OpInfo::isShift(binOp->op)) {
                auto opStr = OpInfo::getText(binOp->op);
                auto& diag = context.addDiag(diag::ConditionalPrecedence,
                                             syntax.question.location());
                diag << opStr << opStr << binOp->sourceRange;

                SourceRange range(binOp->right().sourceRange.start(), right.sourceRange.end());
                diag.addNote(diag::NoteConditionalPrecedenceFix, range);
                diag.addNote(diag::NotePrecedenceSilence, binOp->sourceRange) << opStr;
            }
        }
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}